

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O2

void sensor_menu(void)

{
  ostream *poVar1;
  long lVar2;
  sensor *this;
  char c;
  sensor asStack_d78 [44];
  undefined8 uStack_250;
  byte local_239;
  string local_238;
  string local_218;
  address_type local_1f8;
  address_type local_1d8;
  address_type local_1b8;
  string local_198;
  string local_178;
  address_type local_158;
  sensor local_138 [4];
  
  uStack_250 = 0x1111d5;
  std::__cxx11::string::string((string *)&local_158,"ev3-ports:in1",(allocator *)&local_178);
  uStack_250 = 0x1111e8;
  ev3dev::sensor::sensor(local_138,&local_158);
  uStack_250 = 0x11120c;
  std::__cxx11::string::string((string *)&local_1b8,"ev3-ports:in2",(allocator *)&local_198);
  uStack_250 = 0x11121c;
  ev3dev::sensor::sensor(local_138 + 1,&local_1b8);
  uStack_250 = 0x11123a;
  std::__cxx11::string::string((string *)&local_1d8,"ev3-ports:in3",(allocator *)&local_218);
  uStack_250 = 0x111247;
  ev3dev::sensor::sensor(local_138 + 2,&local_1d8);
  uStack_250 = 0x111265;
  std::__cxx11::string::string((string *)&local_1f8,"ev3-ports:in4",(allocator *)&local_238);
  uStack_250 = 0x111272;
  ev3dev::sensor::sensor(local_138 + 3,&local_1f8);
  uStack_250 = 0x11127c;
  std::__cxx11::string::~string((string *)&local_1f8);
  uStack_250 = 0x111286;
  std::__cxx11::string::~string((string *)&local_1d8);
  uStack_250 = 0x111293;
  std::__cxx11::string::~string((string *)&local_1b8);
  uStack_250 = 0x1112a0;
  std::__cxx11::string::~string((string *)&local_158);
  local_239 = 0;
  do {
    uStack_250 = 0x1112c4;
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uStack_250 = 0x1112d3;
    poVar1 = std::operator<<(poVar1,"*** sensor menu ***");
    uStack_250 = 0x1112db;
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    uStack_250 = 0x1112e3;
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = 0;
    while (lVar2 != 4) {
      if (local_138[lVar2].super_device._path._M_string_length == 0) {
        lVar2 = lVar2 + 1;
      }
      else {
        uStack_250 = 0x111318;
        poVar1 = std::operator<<((ostream *)&std::cout,"(");
        uStack_250 = 0x111326;
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        uStack_250 = 0x111335;
        poVar1 = std::operator<<(poVar1,") ");
        this = local_138 + lVar2;
        uStack_250 = 0x111350;
        ev3dev::sensor::type_name_abi_cxx11_(&local_178,this);
        uStack_250 = 0x11135b;
        poVar1 = std::operator<<(poVar1,(string *)&local_178);
        uStack_250 = 0x11136a;
        poVar1 = std::operator<<(poVar1," (device ");
        uStack_250 = 0x11137b;
        ev3dev::sensor::driver_name_abi_cxx11_(&local_198,this);
        uStack_250 = 0x111386;
        poVar1 = std::operator<<(poVar1,(string *)&local_198);
        uStack_250 = 0x111395;
        poVar1 = std::operator<<(poVar1,", port ");
        uStack_250 = 0x1113a8;
        ev3dev::sensor::address_abi_cxx11_(&local_218,this);
        uStack_250 = 0x1113b3;
        poVar1 = std::operator<<(poVar1,(string *)&local_218);
        uStack_250 = 0x1113c2;
        poVar1 = std::operator<<(poVar1,", mode ");
        uStack_250 = 0x1113d5;
        ev3dev::sensor::mode_abi_cxx11_(&local_238,this);
        uStack_250 = 0x1113e0;
        poVar1 = std::operator<<(poVar1,(string *)&local_238);
        uStack_250 = 0x1113ef;
        poVar1 = std::operator<<(poVar1,")");
        uStack_250 = 0x1113f7;
        std::endl<char,std::char_traits<char>>(poVar1);
        uStack_250 = 0x111401;
        std::__cxx11::string::~string((string *)&local_238);
        uStack_250 = 0x11140b;
        std::__cxx11::string::~string((string *)&local_218);
        uStack_250 = 0x111413;
        std::__cxx11::string::~string((string *)&local_198);
        uStack_250 = 0x11141b;
        std::__cxx11::string::~string((string *)&local_178);
        lVar2 = lVar2 + 1;
      }
    }
    uStack_250 = 0x111434;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uStack_250 = 0x111447;
    poVar1 = std::operator<<((ostream *)&std::cout,"(b)ack");
    uStack_250 = 0x11144f;
    std::endl<char,std::char_traits<char>>(poVar1);
    uStack_250 = 0x11145b;
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uStack_250 = 0x11146a;
    std::operator<<(poVar1,"Choice: ");
    uStack_250 = 0x11147b;
    std::operator>>((istream *)&std::cin,(char *)&local_239);
    if ((byte)(local_239 - 0x31) < 4) {
      uStack_250 = 0x1114a5;
      sensor_action(asStack_d78 + local_239);
    }
  } while (local_239 != 0x62);
  lVar2 = 0xc0;
  do {
    uStack_250 = 0x1114c6;
    ev3dev::sensor::~sensor
              ((sensor *)((long)&local_138[0].super_device._path._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void sensor_menu()
{
  sensor arrSensors[4] {
    { INPUT_1 },
    { INPUT_2 },
    { INPUT_3 },
    { INPUT_4 }
  };

  char c = 0;
  do
  {
    cout << endl
         << "*** sensor menu ***" << endl
         << endl;

    for (unsigned i=0; i<4; ++i)
    {
      sensor &s = arrSensors[i];
      if (s.connected())
      {
        cout << "(" << i+1 << ") " << s.type_name() << " (device " << s.driver_name()
             << ", port " << s.address() << ", mode " << s.mode() << ")" << endl;
      }
    }
    cout << endl;
    cout << "(b)ack"  << endl;
    cout << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case '1':
    case '2':
    case '3':
    case '4':
      sensor_action(arrSensors[c-'1']);
      break;
    }
  }
  while (c != 'b');
}